

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void check_move_buffer(char *str,
                      basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> *buffer)

{
  char *pcVar1;
  AssertHelper local_88;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  undefined1 local_60 [16];
  char *str_local;
  allocator<char> *alloc;
  basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_> buffer2;
  
  alloc = (buffer->super_allocator_ref<std::allocator<char>_>).alloc_;
  str_local = str;
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  basic_memory_buffer(&buffer2,buffer);
  pcVar1 = (buffer->super_basic_buffer<char>).ptr_;
  gtest_ar_2._0_8_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_2,pcVar1,pcVar1 + (buffer->super_basic_buffer<char>).size_);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar,"str","std::string(&buffer[0], buffer.size())",&str_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x124,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_2._0_8_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar_2,buffer2.super_basic_buffer<char>.ptr_,
             buffer2.super_basic_buffer<char>.ptr_ + buffer2.super_basic_buffer<char>.size_);
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)&gtest_ar,"str","std::string(&buffer2[0], buffer2.size())",&str_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x125,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_88.data_._0_4_ = 5;
  gtest_ar._0_8_ = buffer2.super_basic_buffer<char>.capacity_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar_2,"5u","buffer2.capacity()",(uint *)&local_88,
             (unsigned_long *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x126,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  testing::internal::EqHelper<true>::Compare<std::allocator<char>>
            ((EqHelper<true> *)&gtest_ar_2,"nullptr","buffer.get_allocator().get()",(Secret *)0x0,
             (buffer->super_allocator_ref<std::allocator<char>_>).alloc_);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x128,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar._0_8_ = buffer2.super_allocator_ref<std::allocator<char>_>.alloc_;
  testing::internal::CmpHelperEQ<std::allocator<char>*,std::allocator<char>*>
            ((internal *)&gtest_ar_2,"alloc","buffer2.get_allocator().get()",&alloc,
             (allocator<char> **)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x129,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  fmt::v5::basic_memory_buffer<char,_5UL,_allocator_ref<std::allocator<char>_>_>::
  ~basic_memory_buffer(&buffer2);
  return;
}

Assistant:

static void check_move_buffer(const char *str,
                       basic_memory_buffer<char, 5, TestAllocator> &buffer) {
  std::allocator<char> *alloc = buffer.get_allocator().get();
  basic_memory_buffer<char, 5, TestAllocator> buffer2(std::move(buffer));
  // Move shouldn't destroy the inline content of the first buffer.
  EXPECT_EQ(str, std::string(&buffer[0], buffer.size()));
  EXPECT_EQ(str, std::string(&buffer2[0], buffer2.size()));
  EXPECT_EQ(5u, buffer2.capacity());
  // Move should transfer allocator.
  EXPECT_EQ(FMT_NULL, buffer.get_allocator().get());
  EXPECT_EQ(alloc, buffer2.get_allocator().get());
}